

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
          (Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this
          ,initializer_list<robin_hood::pair<char,_double>_> initlist,size_t param_3,
          hash<char,_void> *h,equal_to<char> *equal)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
  *pDVar1;
  pair<char,_double> *in_RCX;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *in_RSI;
  initializer_list<robin_hood::pair<char,_double>_> *in_RDI;
  hash<char,_void> *in_R8;
  equal_to<char> *in_R9;
  initializer_list<robin_hood::pair<char,_double>_> *first;
  
  first = in_RDI;
  WrapHash<robin_hood::hash<char,_void>_>::WrapHash
            ((WrapHash<robin_hood::hash<char,_void>_> *)in_RDI,in_R8);
  WrapKeyEqual<std::equal_to<char>_>::WrapKeyEqual
            ((WrapKeyEqual<std::equal_to<char>_> *)in_RDI,in_R9);
  in_RDI->_M_array = (iterator)0xc4ceb9fe1a85ec53;
  pDVar1 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::DataNode<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,true>*>
                     (in_RDI + 2);
  in_RDI->_M_len = (size_type)pDVar1;
  in_RDI[1]._M_array = (iterator)(in_RDI + 2);
  in_RDI[1]._M_len = 0;
  in_RDI[2]._M_array = (iterator)0x0;
  in_RDI[2]._M_len = 0;
  *(undefined4 *)&in_RDI[3]._M_array = 0x20;
  *(undefined4 *)((long)&in_RDI[3]._M_array + 4) = 0;
  std::initializer_list<robin_hood::pair<char,_double>_>::begin
            ((initializer_list<robin_hood::pair<char,_double>_> *)&stack0xfffffffffffffff0);
  std::initializer_list<robin_hood::pair<char,_double>_>::end(in_RDI);
  Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
  insert<robin_hood::pair<char,double>const*>(in_RSI,(pair<char,_double> *)first,in_RCX);
  return;
}

Assistant:

Table(std::initializer_list<value_type> initlist,
          size_t ROBIN_HOOD_UNUSED(bucket_count) /*unused*/ = 0, const Hash& h = Hash{},
          const KeyEqual& equal = KeyEqual{})
        : WHash(h)
        , WKeyEqual(equal) {
        ROBIN_HOOD_TRACE(this)
        insert(initlist.begin(), initlist.end());
    }